

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

void __thiscall
helics::ConnectorFederateManager::~ConnectorFederateManager(ConnectorFederateManager *this)

{
  gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::
  ~StringMappedVector(&(this->translators).m_obj);
  gmlc::containers::
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  ::~StringMappedVector(&(this->filters).m_obj);
  return;
}

Assistant:

ConnectorFederateManager::~ConnectorFederateManager() = default;